

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::AssertionResult::AssertionResult(AssertionResult *this,AssertionResult *other)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->success_ = other->success_;
  pbVar2 = (other->message_).ptr_;
  if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              operator_new(0x20);
    std::__cxx11::string::string((string *)this_00,(string *)pbVar2);
  }
  (this->message_).ptr_ = this_00;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

AssertionResult::AssertionResult(const AssertionResult& other)
    : success_(other.success_),
      message_(other.message_.get() != NULL ?
               new ::std::string(*other.message_) :
               static_cast< ::std::string*>(NULL)) {
}